

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularSolverMatrix.h
# Opt level: O1

void Eigen::internal::triangular_solve_matrix<double,_long,_1,_2,_false,_0,_0>::run
               (long size,long otherSize,double *_tri,long triStride,double *_other,long otherStride
               ,level3_blocking<double,_double> *blocking)

{
  double dVar1;
  RhsScalar *pRVar2;
  ulong cols_00;
  LhsScalar *pLVar3;
  ulong uVar4;
  undefined8 *puVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  double *pdVar9;
  double *pdVar10;
  long lVar11;
  ulong uVar12;
  double *pdVar13;
  double *pdVar14;
  ulong uVar15;
  size_t __size;
  long lVar16;
  double *pdVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  double dVar21;
  double dStack_1b8;
  long local_1b0;
  ulong local_1a8;
  long local_1a0;
  double *local_198;
  long local_190;
  double *local_188;
  double *local_180;
  long local_178;
  long local_170;
  long local_168;
  long startTarget;
  long local_158;
  long local_150;
  double *local_148;
  RhsScalar *local_140;
  double *local_138;
  ulong local_130;
  double *local_128;
  double *local_120;
  ulong local_118;
  double *local_110;
  ulong local_108;
  ulong local_100;
  int local_f4;
  long lStack_f0;
  int l1;
  double *local_e8;
  double *local_e0;
  ulong local_d8;
  double *local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  RhsScalar *local_b0;
  RhsScalar *local_a8;
  LhsScalar *local_a0;
  RhsScalar *local_98;
  RhsScalar *local_90;
  uint local_88;
  uint local_84;
  int l2;
  int l3;
  double *local_78;
  double *local_70;
  ulong local_68;
  ulong local_60;
  LhsScalar *local_58;
  RhsScalar local_50;
  long cols;
  ulong uStack_40;
  gemm_pack_rhs<double,_long,_4,_0,_false,_true> pack_rhs;
  gebp_kernel<double,_double,_long,_4,_4,_false,_false> local_32;
  gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> local_31 [7];
  gebp_kernel<double,_double,_long,_4,_4,_false,_false> gebp_kernel;
  gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> pack_lhs;
  
  pdVar9 = &dStack_1b8;
  local_60 = triStride;
  local_e8 = _tri;
  local_50 = (RhsScalar)otherSize;
  local_c8 = blocking->m_mc;
  if (size <= blocking->m_mc) {
    local_c8 = size;
  }
  uStack_40 = blocking->m_kc;
  uVar20 = local_c8 * blocking->m_kc;
  if (uVar20 >> 0x3d != 0) {
LAB_00111d9e:
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = operator_delete;
    __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_58 = blocking->m_blockA;
  if (blocking->m_blockA == (LhsScalar *)0x0) {
    if (uVar20 < 0x4001) {
      pdVar9 = (double *)((long)&dStack_1b8 - (uVar20 * 8 + 0xf & 0xfffffffffffffff0));
      local_a0 = pdVar9;
      local_58 = pdVar9;
    }
    else {
      local_58 = (LhsScalar *)malloc(uVar20 * 8);
      local_a0 = local_58;
      if (local_58 == (LhsScalar *)0x0) goto LAB_00111d9e;
    }
  }
  else {
    local_a0 = (LhsScalar *)0x0;
    pdVar9 = &dStack_1b8;
  }
  uVar8 = uStack_40 * (long)local_50;
  local_c0 = uVar8;
  if (0x1fffffffffffffff < uVar8) {
    pdVar9[-1] = 5.54218138222418e-318;
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = operator_delete;
    pdVar9[-1] = 5.54235924585669e-318;
    __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_a8 = blocking->m_blockB;
  if (blocking->m_blockB == (RhsScalar *)0x0) {
    if (uVar8 < 0x4001) {
      pdVar9 = (double *)((long)pdVar9 - (uVar8 * 8 + 0xf & 0xfffffffffffffff0));
      local_98 = pdVar9;
      local_a8 = pdVar9;
    }
    else {
      pdVar9[-1] = 5.53244334834465e-318;
      local_a8 = (RhsScalar *)malloc(uVar8 * 8);
      local_98 = local_a8;
      if (local_a8 == (RhsScalar *)0x0) {
        pdVar9[-1] = 5.54266062590065e-318;
        puVar5 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar5 = operator_delete;
        pdVar9[-1] = 5.54283848953315e-318;
        __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
    }
  }
  else {
    local_98 = (RhsScalar *)0x0;
  }
  uVar8 = local_60;
  if ((uStack_40 & 0x1c00000000000000) != 0) {
    pdVar9[-1] = 5.54240865242127e-318;
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = operator_delete;
    pdVar9[-1] = 5.54258651605377e-318;
    __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_b0 = blocking->m_blockW;
  if (blocking->m_blockW == (RhsScalar *)0x0) {
    __size = uStack_40 * 0x40;
    if (__size < 0x20001) {
      pdVar9 = pdVar9 + uStack_40 * -8;
      local_90 = pdVar9;
      local_b0 = pdVar9;
    }
    else {
      pdVar9[-1] = 5.53311033696654e-318;
      local_b0 = (RhsScalar *)malloc(__size);
      local_90 = local_b0;
      if (local_b0 == (RhsScalar *)0x0) {
        pdVar9[-1] = 5.54288789609774e-318;
        puVar5 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar5 = operator_delete;
        pdVar9[-1] = (double)&LAB_00111e89;
        __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
    }
  }
  else {
    local_90 = (RhsScalar *)0x0;
  }
  local_100 = uStack_40 << 6;
  local_108 = uVar20;
  if (manage_caching_sizes(Eigen::Action,long*,long*)::m_l2CacheSize == 0) {
    local_f4 = -1;
    pdVar9[-1] = 5.53351053013967e-318;
    queryCacheSizes(&local_f4,(int *)&local_88,(int *)&local_84);
    iVar6 = 0x2000;
    if (0 < local_f4) {
      iVar6 = local_f4;
    }
    manage_caching_sizes(Eigen::Action,long*,long*)::m_l1CacheSize = (long)iVar6;
    local_88 = 0xffffffff;
    local_84 = 0xffffffff;
    pdVar9[-1] = 5.53376250361905e-318;
    queryCacheSizes(&local_f4,(int *)&local_88,(int *)&local_84);
    uVar7 = local_84;
    if ((int)local_84 < (int)local_88) {
      uVar7 = local_88;
    }
    manage_caching_sizes(Eigen::Action,long*,long*)::m_l2CacheSize = 0x100000;
    if (0 < (int)uVar7) {
      manage_caching_sizes(Eigen::Action,long*,long*)::m_l2CacheSize = (ulong)uVar7;
    }
  }
  if ((long)local_50 < 1) {
    uVar20 = 0;
  }
  else {
    lVar11 = size;
    if (size < otherStride) {
      lVar11 = otherStride;
    }
    uVar4 = manage_caching_sizes(Eigen::Action,long*,long*)::m_l2CacheSize / (ulong)(lVar11 << 5);
    uVar20 = uVar4 + 3;
    if (-1 < (long)uVar4) {
      uVar20 = uVar4;
    }
    uVar20 = uVar20 & 0xfffffffffffffffc;
  }
  if ((long)uVar20 < 5) {
    uVar20 = 4;
  }
  if (0 < size) {
    local_120 = _other + size;
    startTarget = uStack_40 * -8;
    local_170 = otherStride * uVar20 * 8;
    local_128 = local_e8 + (size + -1) * uVar8 + size;
    local_158 = (uVar8 * 8 ^ 0xfffffffffffffff8) * uStack_40;
    local_190 = ~uVar8 << 5;
    local_1b0 = uVar8 * -8;
    local_178 = local_c8 * 8;
    local_118 = size - uStack_40;
    local_110 = local_e8 + uVar8 * (size - uStack_40);
    local_150 = uStack_40 * uVar8 * -8;
    local_130 = uVar20;
    do {
      local_68 = size;
      uVar20 = size;
      if ((long)uStack_40 < size) {
        uVar20 = uStack_40;
      }
      _l2 = uVar20;
      if (0 < (long)local_50) {
        local_168 = size - uVar20;
        local_180 = local_e8 + (size - uVar20);
        local_d0 = local_120;
        lVar11 = 0;
        uVar4 = uVar20;
        do {
          lStack_f0 = lVar11;
          local_b8 = (long)local_50 - lVar11;
          uVar12 = local_b8;
          if ((long)local_130 < (long)local_b8) {
            uVar12 = local_130;
          }
          local_d8 = uVar12;
          uVar20 = uVar4;
          if (0 < (long)uVar4) {
            local_140 = local_a8 + lVar11 * uVar4;
            local_198 = _other + lVar11 * otherStride;
            local_188 = _other + lVar11 * otherStride + local_168;
            local_e0 = local_128;
            local_138 = local_d0;
            pdVar14 = (double *)0x0;
            do {
              cols_00 = local_d8;
              pRVar2 = local_140;
              local_1a8 = uVar4;
              uVar15 = 4;
              if ((long)uVar4 < 4) {
                uVar15 = uVar4;
              }
              uVar4 = 1;
              if (1 < (long)uVar15) {
                uVar4 = uVar15;
              }
              local_78 = pdVar14;
              local_148 = (double *)(uVar20 - (long)pdVar14);
              pdVar10 = (double *)0x4;
              if ((long)local_148 < 4) {
                pdVar10 = local_148;
              }
              local_70 = pdVar10;
              if (0 < (long)local_148) {
                pdVar13 = local_e0 + -uVar15;
                uVar20 = 0;
                do {
                  if (0 < (long)local_b8) {
                    lVar16 = ~((long)pdVar14 + uVar20) + local_68;
                    dVar1 = local_e8[lVar16 * uVar8 + lVar16];
                    pdVar17 = local_138 + -uVar15;
                    lVar18 = lStack_f0;
                    do {
                      dVar21 = _other[lVar18 * otherStride + lVar16] * (1.0 / dVar1);
                      _other[lVar18 * otherStride + lVar16] = dVar21;
                      if (0 < (long)(~uVar20 + (long)pdVar10)) {
                        lVar19 = 0;
                        do {
                          pdVar17[lVar19] = pdVar13[lVar19] * -dVar21 + pdVar17[lVar19];
                          lVar19 = lVar19 + 1;
                        } while (lVar19 < (long)(~uVar20 + (long)pdVar10));
                      }
                      lVar18 = lVar18 + 1;
                      pdVar17 = pdVar17 + otherStride;
                    } while (lVar18 < (long)(uVar12 + lVar11));
                  }
                  uVar20 = uVar20 + 1;
                  pdVar13 = (double *)((long)pdVar13 + local_1b0);
                } while (uVar20 != uVar4);
              }
              local_1a0 = local_68 - ((long)pdVar14 + (long)pdVar10);
              pdVar14 = local_198 + local_1a0;
              pdVar9[-1] = (double)((long)local_148 - (long)pdVar10);
              pdVar9[-2] = (double)_l2;
              pdVar9[-3] = 5.53838201740766e-318;
              gemm_pack_rhs<double,_long,_4,_0,_false,_true>::operator()
                        ((gemm_pack_rhs<double,_long,_4,_0,_false,_true> *)((long)&cols + 7),pRVar2,
                         pdVar14,otherStride,(long)pdVar10,cols_00,(long)pdVar9[-2],(long)pdVar9[-1]
                        );
              uVar20 = local_60;
              lVar18 = (long)local_148 - (long)pdVar10;
              if (lVar18 != 0 && (long)pdVar10 <= (long)local_148) {
                pdVar14 = local_180 + local_1a0 * local_60;
                pdVar9[-2] = 0.0;
                pdVar9[-1] = 0.0;
                pLVar3 = local_58;
                pdVar9[-3] = 5.53876738861142e-318;
                gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false>::operator()
                          (local_31,pLVar3,pdVar14,uVar20,(long)pdVar10,lVar18,(long)pdVar9[-2],
                           (long)pdVar9[-1]);
                pLVar3 = local_58;
                pdVar10 = local_70;
                pRVar2 = local_140;
                pdVar14 = local_188;
                pdVar9[-2] = (double)local_b0;
                pdVar9[-3] = (double)lVar18;
                pdVar9[-4] = 0.0;
                pdVar9[-5] = (double)_l2;
                pdVar9[-6] = (double)pdVar10;
                pdVar9[-7] = (double)local_d8;
                pdVar9[-8] = (double)pdVar10;
                pdVar9[-9] = 5.53912805653288e-318;
                gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
                          (&local_32,pdVar14,otherStride,pLVar3,pRVar2,lVar18,(long)pdVar9[-8],
                           (long)pdVar9[-7],-1.0,(long)pdVar9[-6],(long)pdVar9[-5],(long)pdVar9[-4],
                           (long)pdVar9[-3],(double *)pdVar9[-2]);
              }
              pdVar14 = (double *)((long)local_78 + 4);
              uVar4 = local_1a8 - 4;
              local_138 = local_138 + -4;
              local_e0 = (double *)((long)local_e0 + local_190);
              uVar8 = local_60;
              uVar20 = _l2;
            } while ((long)pdVar14 < (long)_l2);
          }
          lVar11 = lStack_f0 + local_130;
          local_d0 = (double *)((long)local_d0 + local_170);
          uVar4 = uVar20;
        } while (lVar11 < (long)local_50);
      }
      uVar8 = local_68;
      local_68 = local_68 - uStack_40;
      if (local_68 != 0 && (long)uStack_40 <= (long)uVar8) {
        local_78 = local_110;
        local_b8 = local_118;
        local_70 = _other;
        lVar11 = 0;
        do {
          uVar8 = local_b8;
          local_b8 = local_b8 - local_c8;
          if ((long)local_c8 <= (long)uVar8) {
            uVar8 = local_c8;
          }
          if (0 < (long)uVar8) {
            pdVar9[-2] = 0.0;
            pdVar9[-1] = 0.0;
            pLVar3 = local_58;
            uVar4 = local_60;
            pdVar14 = local_78;
            pdVar9[-3] = 5.54032863605228e-318;
            gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false>::operator()
                      (local_31,pLVar3,pdVar14,uVar4,uVar20,uVar8,(long)pdVar9[-2],(long)pdVar9[-1])
            ;
            uVar20 = _l2;
            pdVar9[-2] = (double)local_b0;
            pdVar9[-4] = 0.0;
            pdVar9[-3] = 0.0;
            pdVar9[-5] = -NAN;
            pdVar9[-6] = -NAN;
            pdVar9[-7] = local_50;
            pdVar9[-8] = (double)uVar20;
            pLVar3 = local_58;
            pdVar14 = local_70;
            pRVar2 = local_a8;
            pdVar9[-9] = 5.54083258301104e-318;
            gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
                      (&local_32,pdVar14,otherStride,pLVar3,pRVar2,uVar8,(long)pdVar9[-8],
                       (long)pdVar9[-7],-1.0,(long)pdVar9[-6],(long)pdVar9[-5],(long)pdVar9[-4],
                       (long)pdVar9[-3],(double *)pdVar9[-2]);
            uVar20 = _l2;
          }
          lVar11 = lVar11 + local_c8;
          local_70 = (double *)((long)local_70 + local_178);
          local_78 = (double *)((long)local_78 + local_178);
        } while (lVar11 < (long)local_68);
      }
      local_120 = (double *)((long)local_120 + startTarget);
      local_128 = (double *)((long)local_128 + local_158);
      local_118 = local_118 - uStack_40;
      local_110 = (double *)((long)local_110 + local_150);
      uVar8 = local_60;
      size = local_68;
    } while (0 < (long)local_68);
  }
  pRVar2 = local_90;
  if (0x20000 < local_100) {
    pdVar9[-1] = 5.54156874082334e-318;
    free(pRVar2);
  }
  pRVar2 = local_98;
  uVar20 = local_108;
  if (0x4000 < local_c0) {
    pdVar9[-1] = 5.54172684183001e-318;
    free(pRVar2);
  }
  pLVar3 = local_a0;
  if (0x4000 < uVar20) {
    pdVar9[-1] = 5.54183059561564e-318;
    free(pLVar3);
  }
  return;
}

Assistant:

EIGEN_DONT_INLINE void triangular_solve_matrix<Scalar,Index,OnTheLeft,Mode,Conjugate,TriStorageOrder,ColMajor>::run(
    Index size, Index otherSize,
    const Scalar* _tri, Index triStride,
    Scalar* _other, Index otherStride,
    level3_blocking<Scalar,Scalar>& blocking)
  {
    Index cols = otherSize;
    const_blas_data_mapper<Scalar, Index, TriStorageOrder> tri(_tri,triStride);
    blas_data_mapper<Scalar, Index, ColMajor> other(_other,otherStride);

    typedef gebp_traits<Scalar,Scalar> Traits;
    enum {
      SmallPanelWidth   = EIGEN_PLAIN_ENUM_MAX(Traits::mr,Traits::nr),
      IsLower = (Mode&Lower) == Lower
    };

    Index kc = blocking.kc();                   // cache block size along the K direction
    Index mc = (std::min)(size,blocking.mc());  // cache block size along the M direction

    std::size_t sizeA = kc*mc;
    std::size_t sizeB = kc*cols;
    std::size_t sizeW = kc*Traits::WorkSpaceFactor;

    ei_declare_aligned_stack_constructed_variable(Scalar, blockA, sizeA, blocking.blockA());
    ei_declare_aligned_stack_constructed_variable(Scalar, blockB, sizeB, blocking.blockB());
    ei_declare_aligned_stack_constructed_variable(Scalar, blockW, sizeW, blocking.blockW());

    conj_if<Conjugate> conj;
    gebp_kernel<Scalar, Scalar, Index, Traits::mr, Traits::nr, Conjugate, false> gebp_kernel;
    gemm_pack_lhs<Scalar, Index, Traits::mr, Traits::LhsProgress, TriStorageOrder> pack_lhs;
    gemm_pack_rhs<Scalar, Index, Traits::nr, ColMajor, false, true> pack_rhs;

    // the goal here is to subdivise the Rhs panels such that we keep some cache
    // coherence when accessing the rhs elements
    std::ptrdiff_t l1, l2;
    manage_caching_sizes(GetAction, &l1, &l2);
    Index subcols = cols>0 ? l2/(4 * sizeof(Scalar) *  std::max<Index>(otherStride,size)) : 0;
    subcols = std::max<Index>((subcols/Traits::nr)*Traits::nr, Traits::nr);

    for(Index k2=IsLower ? 0 : size;
        IsLower ? k2<size : k2>0;
        IsLower ? k2+=kc : k2-=kc)
    {
      const Index actual_kc = (std::min)(IsLower ? size-k2 : k2, kc);

      // We have selected and packed a big horizontal panel R1 of rhs. Let B be the packed copy of this panel,
      // and R2 the remaining part of rhs. The corresponding vertical panel of lhs is split into
      // A11 (the triangular part) and A21 the remaining rectangular part.
      // Then the high level algorithm is:
      //  - B = R1                    => general block copy (done during the next step)
      //  - R1 = A11^-1 B             => tricky part
      //  - update B from the new R1  => actually this has to be performed continuously during the above step
      //  - R2 -= A21 * B             => GEPP

      // The tricky part: compute R1 = A11^-1 B while updating B from R1
      // The idea is to split A11 into multiple small vertical panels.
      // Each panel can be split into a small triangular part T1k which is processed without optimization,
      // and the remaining small part T2k which is processed using gebp with appropriate block strides
      for(Index j2=0; j2<cols; j2+=subcols)
      {
        Index actual_cols = (std::min)(cols-j2,subcols);
        // for each small vertical panels [T1k^T, T2k^T]^T of lhs
        for (Index k1=0; k1<actual_kc; k1+=SmallPanelWidth)
        {
          Index actualPanelWidth = std::min<Index>(actual_kc-k1, SmallPanelWidth);
          // tr solve
          for (Index k=0; k<actualPanelWidth; ++k)
          {
            // TODO write a small kernel handling this (can be shared with trsv)
            Index i  = IsLower ? k2+k1+k : k2-k1-k-1;
            Index rs = actualPanelWidth - k - 1; // remaining size
            Index s  = TriStorageOrder==RowMajor ? (IsLower ? k2+k1 : i+1)
                                                 :  IsLower ? i+1 : i-rs;

            Scalar a = (Mode & UnitDiag) ? Scalar(1) : Scalar(1)/conj(tri(i,i));
            for (Index j=j2; j<j2+actual_cols; ++j)
            {
              if (TriStorageOrder==RowMajor)
              {
                Scalar b(0);
                const Scalar* l = &tri(i,s);
                Scalar* r = &other(s,j);
                for (Index i3=0; i3<k; ++i3)
                  b += conj(l[i3]) * r[i3];

                other(i,j) = (other(i,j) - b)*a;
              }
              else
              {
                Scalar b = (other(i,j) *= a);
                Scalar* r = &other(s,j);
                const Scalar* l = &tri(s,i);
                for (Index i3=0;i3<rs;++i3)
                  r[i3] -= b * conj(l[i3]);
              }
            }
          }

          Index lengthTarget = actual_kc-k1-actualPanelWidth;
          Index startBlock   = IsLower ? k2+k1 : k2-k1-actualPanelWidth;
          Index blockBOffset = IsLower ? k1 : lengthTarget;

          // update the respective rows of B from other
          pack_rhs(blockB+actual_kc*j2, &other(startBlock,j2), otherStride, actualPanelWidth, actual_cols, actual_kc, blockBOffset);

          // GEBP
          if (lengthTarget>0)
          {
            Index startTarget  = IsLower ? k2+k1+actualPanelWidth : k2-actual_kc;

            pack_lhs(blockA, &tri(startTarget,startBlock), triStride, actualPanelWidth, lengthTarget);

            gebp_kernel(&other(startTarget,j2), otherStride, blockA, blockB+actual_kc*j2, lengthTarget, actualPanelWidth, actual_cols, Scalar(-1),
                        actualPanelWidth, actual_kc, 0, blockBOffset, blockW);
          }
        }
      }
      
      // R2 -= A21 * B => GEPP
      {
        Index start = IsLower ? k2+kc : 0;
        Index end   = IsLower ? size : k2-kc;
        for(Index i2=start; i2<end; i2+=mc)
        {
          const Index actual_mc = (std::min)(mc,end-i2);
          if (actual_mc>0)
          {
            pack_lhs(blockA, &tri(i2, IsLower ? k2 : k2-kc), triStride, actual_kc, actual_mc);

            gebp_kernel(_other+i2, otherStride, blockA, blockB, actual_mc, actual_kc, cols, Scalar(-1), -1, -1, 0, 0, blockW);
          }
        }
      }
    }
  }